

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O2

void uv::TCPClient::AfterClientClose(uv_handle_t *handle)

{
  char *pcVar1;
  void *pvVar2;
  int errcode;
  CStringStream *pCVar3;
  ILog4zManager *pIVar4;
  long *in_FS_OFFSET;
  string sStack_58;
  CStringStream ss;
  
  pvVar2 = handle->data;
  fprintf(_stdout,"Close CB handle %p\n",handle);
  if ((*(uv_handle_t **)((long)pvVar2 + 8) == handle) && (*(char *)((long)pvVar2 + 0x588) == '\x01')
     ) {
    errcode = uv_timer_start((long)pvVar2 + 0x4f0,ReconnectTimer,
                             *(undefined8 *)((long)pvVar2 + 0x590));
    if (errcode != 0) {
      uv_close((long)pvVar2 + 0x4f0,AfterClientClose);
      ss.m_pEnd = (char *)*in_FS_OFFSET;
      pcVar1 = ss.m_pEnd + -0x800;
      ss.m_pBegin = pcVar1;
      ss.m_pCur = pcVar1;
      GetUVError_abi_cxx11_(&sStack_58,errcode);
      zsummer::log4z::CStringStream::operator<<(&ss,&sStack_58);
      std::__cxx11::string::~string((string *)&sStack_58);
      pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ");
      pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ) : ");
      zsummer::log4z::CStringStream::operator<<(pCVar3,0x1a1);
      pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
      (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,3,pcVar1);
    }
  }
  return;
}

Assistant:

void TCPClient::AfterClientClose(uv_handle_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    fprintf(stdout, "Close CB handle %p\n", handle);
    if (handle == (uv_handle_t*)&theclass->client_handle_->tcphandle && theclass->isreconnecting_) {
        //closed, start reconnect timer
        int iret = 0;
        iret = uv_timer_start(&theclass->reconnect_timer_, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
        if (iret) {
            uv_close((uv_handle_t*)&theclass->reconnect_timer_, TCPClient::AfterClientClose);
            LOGE(GetUVError(iret));
            return;
        }
    }
}